

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3.cpp
# Opt level: O0

Vector3 * __thiscall Vector3::reflect(Vector3 *__return_storage_ptr__,Vector3 *this,Vector3 *n)

{
  double dVar1;
  Vector3 local_30;
  Vector3 *local_18;
  Vector3 *n_local;
  Vector3 *this_local;
  
  local_18 = n;
  n_local = this;
  dVar1 = dot(this,n);
  operator*(&local_30,n,dVar1 * 2.0);
  ::operator-(__return_storage_ptr__,this,&local_30);
  return __return_storage_ptr__;
}

Assistant:

Vector3 Vector3::reflect(const Vector3& n) const
{
    return *this - n * (2 * this->dot(n));
}